

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFront.h
# Opt level: O0

void __thiscall
TPZFront<float>::STensorProductMTData::~STensorProductMTData(STensorProductMTData *this)

{
  int iVar1;
  TPZSemaphore *this_00;
  pair<int,_TPZFront<float>::STensorProductMTData_*> **pppVar2;
  long in_RDI;
  int i_1;
  int i;
  int nthreads;
  TPZVec<std::pair<int,_TPZFront<float>::STensorProductMTData_*>_*> *in_stack_ffffffffffffffc0;
  TPZSemaphore *in_stack_ffffffffffffffd0;
  undefined4 local_14;
  undefined4 local_10;
  
  *(undefined1 *)(in_RDI + 0x108) = 0;
  this_00 = (TPZSemaphore *)TPZVec<TPZSemaphore>::NElements((TPZVec<TPZSemaphore> *)(in_RDI + 0x90))
  ;
  iVar1 = (int)this_00;
  for (local_10 = 0; local_10 < iVar1; local_10 = local_10 + 1) {
    in_stack_ffffffffffffffd0 =
         TPZVec<TPZSemaphore>::operator[]((TPZVec<TPZSemaphore> *)(in_RDI + 0x90),(long)local_10);
    TPZSemaphore::Post(this_00);
  }
  for (local_14 = 0; local_14 < iVar1; local_14 = local_14 + 1) {
    std::vector<std::thread,_std::allocator<std::thread>_>::operator[]
              ((vector<std::thread,_std::allocator<std::thread>_> *)(in_RDI + 0xb0),(long)local_14);
    std::thread::join();
    pppVar2 = TPZVec<std::pair<int,_TPZFront<float>::STensorProductMTData_*>_*>::operator[]
                        ((TPZVec<std::pair<int,_TPZFront<float>::STensorProductMTData_*>_*> *)
                         (in_RDI + 0xe0),(long)local_14);
    in_stack_ffffffffffffffc0 =
         (TPZVec<std::pair<int,_TPZFront<float>::STensorProductMTData_*>_*> *)*pppVar2;
    if (in_stack_ffffffffffffffc0 !=
        (TPZVec<std::pair<int,_TPZFront<float>::STensorProductMTData_*>_*> *)0x0) {
      operator_delete(in_stack_ffffffffffffffc0,0x10);
    }
    pppVar2 = TPZVec<std::pair<int,_TPZFront<float>::STensorProductMTData_*>_*>::operator[]
                        ((TPZVec<std::pair<int,_TPZFront<float>::STensorProductMTData_*>_*> *)
                         (in_RDI + 0xe0),(long)local_14);
    *pppVar2 = (pair<int,_TPZFront<float>::STensorProductMTData_*> *)0x0;
  }
  TPZVec<std::pair<int,_TPZFront<float>::STensorProductMTData_*>_*>::~TPZVec
            (in_stack_ffffffffffffffc0);
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)in_stack_ffffffffffffffd0);
  TPZVec<TPZSemaphore>::~TPZVec((TPZVec<TPZSemaphore> *)this_00);
  TPZSemaphore::~TPZSemaphore((TPZSemaphore *)0x1cc61a9);
  return;
}

Assistant:

~STensorProductMTData(){
			
			this->fRunning = false;
			const int nthreads = fWorkSem.NElements();
			for(int i = 0; i < nthreads; i++){
        fWorkSem[i].Post();
			}
			for(int i = 0; i < nthreads; i++){
        fThreads[i].join();
				delete fThreadData[i];
				fThreadData[i] = NULL;
			}
			
		}